

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O0

char * archive_read_disk_entry_setup_path(archive_read_disk *a,archive_entry *entry,int *fd)

{
  int iVar1;
  mode_t mVar2;
  char *local_28;
  char *path;
  int *fd_local;
  archive_entry *entry_local;
  archive_read_disk *a_local;
  
  local_28 = archive_entry_sourcepath(entry);
  if ((local_28 == (char *)0x0) ||
     ((a->tree != (tree *)0x0 && (iVar1 = (*a->tree_enter_working_dir)(a->tree), iVar1 != 0)))) {
    local_28 = archive_entry_pathname(entry);
  }
  if (local_28 == (char *)0x0) {
    archive_set_error(&a->archive,-1,"Couldn\'t determine path");
  }
  else if ((((fd != (int *)0x0) && (*fd < 0)) && (a->tree != (tree *)0x0)) &&
          ((a->follow_symlinks != '\0' || (mVar2 = archive_entry_filetype(entry), mVar2 != 0xa000)))
          ) {
    iVar1 = (*a->open_on_current_dir)(a->tree,local_28,0x800);
    *fd = iVar1;
  }
  return local_28;
}

Assistant:

const char *
archive_read_disk_entry_setup_path(struct archive_read_disk *a,
    struct archive_entry *entry, int *fd)
{
	const char *path;

	path = archive_entry_sourcepath(entry);

	if (path == NULL || (a->tree != NULL &&
	    a->tree_enter_working_dir(a->tree) != 0))
		path = archive_entry_pathname(entry);
	if (path == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		   "Couldn't determine path");
	} else if (fd != NULL && *fd < 0 && a->tree != NULL &&
	    (a->follow_symlinks || archive_entry_filetype(entry) != AE_IFLNK)) {
		*fd = a->open_on_current_dir(a->tree, path,
		    O_RDONLY | O_NONBLOCK);
	}
	return (path);
}